

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O0

float __thiscall anon_unknown.dwarf_45a12::MapDriver::maxSpeedForCurvature(MapDriver *this)

{
  MapDriver *in_RDI;
  float fVar1;
  float extraout_XMM0_Da;
  undefined4 uVar2;
  Vec3 VVar3;
  float headingSpeed;
  float mw;
  Vec3 *in_stack_00000028;
  PolylineSegmentedPathwaySegmentRadii *in_stack_00000030;
  float parallelness;
  Vec3 pathHeading;
  float curveSpeed;
  float relativeCurvature;
  float maxC;
  float absC;
  float maxRelativeSpeed;
  float local_a4;
  float local_8c;
  float local_88;
  float local_84 [3];
  float local_78;
  Vec3 local_70;
  float local_64;
  Vec3 local_60 [2];
  undefined4 local_48;
  undefined4 local_38;
  Vec3 local_30;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  local_c = 1.0;
  fVar1 = local_c;
  if ((in_RDI->curvedSteering & 1U) != 0) {
    OpenSteer::SimpleVehicle::curvature(&in_RDI->super_SimpleVehicle);
    local_10 = OpenSteer::absXXX(0.0);
    local_14 = minimumTurningRadius(in_RDI);
    local_14 = 1.0 / local_14;
    OpenSteer::clip(local_10 / local_14,0.0,1.0);
    local_18 = OpenSteer::sqrtXXX(0.0);
    local_20 = 1.0;
    uVar2 = 0x3dcccccd;
    local_24 = 0.1;
    local_1c = OpenSteer::interpolate<float>(local_18,&local_20,&local_24);
    in_RDI->annoteMaxRelSpeedCurve = local_1c;
    fVar1 = local_1c;
    if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
      (*(in_RDI->super_SimpleVehicle).super_SimpleVehicle_3.
        super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
        super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
        super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])();
      local_48 = uVar2;
      local_38 = uVar2;
      VVar3 = mapPointAndDirectionToTangent(in_stack_00000030,in_stack_00000028,(int)mw);
      fVar1 = VVar3.z;
      local_60[0]._0_8_ = VVar3._0_8_;
      local_30.x = local_60[0].x;
      local_30.y = local_60[0].y;
      local_60[0] = VVar3;
      local_30.z = fVar1;
      (*(in_RDI->super_SimpleVehicle).super_SimpleVehicle_3.
        super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
        super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
        super_AbstractLocalSpace._vptr_AbstractLocalSpace[6])();
      local_78 = fVar1;
      local_70.z = fVar1;
      local_64 = OpenSteer::Vec3::dot(&local_30,&local_70);
      local_84[0] = 0.2;
      if (0.0 <= local_64) {
        local_8c = 1.0;
        local_a4 = OpenSteer::interpolate<float>(local_64,local_84,&local_8c);
      }
      else {
        local_a4 = 0.2;
      }
      local_88 = local_a4;
      fVar1 = OpenSteer::minXXX(0.0,1.824816e-39);
      in_RDI->annoteMaxRelSpeedPath = local_88;
    }
  }
  local_c = fVar1;
  in_RDI->annoteMaxRelSpeed = local_c;
  (*(in_RDI->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x20])();
  return extraout_XMM0_Da * local_c;
}

Assistant:

float maxSpeedForCurvature ()
        {
            float maxRelativeSpeed = 1;

            if (curvedSteering)
            {
                // compute an ad hoc "relative curvature"
                const float absC = absXXX (curvature ());
                const float maxC = 1 / minimumTurningRadius ();
                const float relativeCurvature = sqrtXXX (clip (absC/maxC, 0, 1));

                // map from full throttle when straight to 10% at max curvature
                const float curveSpeed = interpolate (relativeCurvature,1.0f,0.1f);
                annoteMaxRelSpeedCurve = curveSpeed;

                if (demoSelect != 2)
                {
                    maxRelativeSpeed = curveSpeed;
                }
                else
                {
                    // heading (unit tangent) of the path segment of interest
                    const Vec3 pathHeading =  mapPointAndDirectionToTangent( *path, position(), pathFollowDirection ); // path->tangentAt (position (), pathFollowDirection);
                    // measure how parallel we are to the path
                    const float parallelness = pathHeading.dot (forward ());

                    // determine relative speed for this heading
                    const float mw = 0.2f;
                    const float headingSpeed = ((parallelness < 0) ? mw :
                                                interpolate (parallelness,
                                                             mw, 1.0f));
                    maxRelativeSpeed = minXXX (curveSpeed, headingSpeed);
                    annoteMaxRelSpeedPath = headingSpeed;
                }
            }
            annoteMaxRelSpeed = maxRelativeSpeed;
            return maxSpeed () * maxRelativeSpeed;
        }